

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O1

size_t __thiscall bssl::DTLSOutgoingMessage::msg_len(DTLSOutgoingMessage *this)

{
  ulong uVar1;
  
  if (this->is_ccs == true) {
    __assert_fail("!is_ccs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                  ,0xb8f,"size_t bssl::DTLSOutgoingMessage::msg_len() const");
  }
  uVar1 = (this->data).size_;
  if (0xb < uVar1) {
    return uVar1 - 0xc;
  }
  __assert_fail("data.size() >= DTLS1_HM_HEADER_LENGTH",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/internal.h"
                ,0xb90,"size_t bssl::DTLSOutgoingMessage::msg_len() const");
}

Assistant:

size_t msg_len() const {
    assert(!is_ccs);
    assert(data.size() >= DTLS1_HM_HEADER_LENGTH);
    return data.size() - DTLS1_HM_HEADER_LENGTH;
  }